

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O0

void socketreceiver_set_fromaddrfn(_socketreceiver *x,t_socketfromaddrfn fromaddrfn)

{
  sockaddr_storage *psVar1;
  t_socketfromaddrfn fromaddrfn_local;
  _socketreceiver *x_local;
  
  x->sr_fromaddrfn = fromaddrfn;
  if (fromaddrfn == (t_socketfromaddrfn)0x0) {
    if (x->sr_fromaddr != (sockaddr_storage *)0x0) {
      free(x->sr_fromaddr);
      x->sr_fromaddr = (sockaddr_storage *)0x0;
    }
  }
  else if (x->sr_fromaddr == (sockaddr_storage *)0x0) {
    psVar1 = (sockaddr_storage *)malloc(0x80);
    x->sr_fromaddr = psVar1;
  }
  return;
}

Assistant:

void socketreceiver_set_fromaddrfn(t_socketreceiver *x,
    t_socketfromaddrfn fromaddrfn)
{
    x->sr_fromaddrfn = fromaddrfn;
    if (fromaddrfn)
    {
        if (!x->sr_fromaddr)
            x->sr_fromaddr = malloc(sizeof(struct sockaddr_storage));
    }
    else if (x->sr_fromaddr)
    {
        free(x->sr_fromaddr);
        x->sr_fromaddr = NULL;
    }
}